

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

vector<Image,_std::allocator<Image>_> *
getContainerImages(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,string *rootDir)

{
  recursive_directory_iterator *this;
  pointer pcVar1;
  size_type sVar2;
  ulong uVar3;
  uint uVar4;
  path *ppVar5;
  long lVar6;
  char *__s;
  undefined8 uVar7;
  path *__p;
  undefined1 local_208 [8];
  stat attr;
  string local_168;
  undefined1 auStack_148 [8];
  recursive_directory_iterator __end1;
  string local_130;
  undefined1 local_110 [8];
  string lastModified;
  string local_e0;
  size_type *local_c0;
  string imageId;
  recursive_directory_iterator __begin1;
  element_type *local_88;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  vector<Image,_std::allocator<Image>_> *local_38;
  
  (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = (undefined1  [8])&__str._M_string_length;
  pcVar1 = (rootDir->_M_dataplus)._M_p;
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + rootDir->_M_string_length);
  std::__cxx11::string::append(local_80);
  std::filesystem::__cxx11::path::path((path *)local_208,(string_type *)local_80,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&__begin1._M_dirs._M_refcount,(path *)local_208,none,
             (error_code *)0x0);
  std::filesystem::__cxx11::path::~path((path *)local_208);
  if (local_80 != (undefined1  [8])&__str._M_string_length) {
    operator_delete((void *)local_80,__str._M_string_length + 1);
  }
  if (local_88 == (element_type *)0x0) {
    __begin1._M_dirs._M_ptr = (element_type *)0x0;
  }
  else {
    __begin1._M_dirs._M_ptr = local_88;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
    }
  }
  lastModified.field_2._8_8_ = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)((long)&lastModified.field_2 + 8));
  attr.__glibc_reserved[2] = (__syscall_slong_t)__begin1._M_dirs._M_refcount._M_pi;
  if (local_88 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_88 + 8) = *(int *)(local_88 + 8) + 1;
    }
  }
  auStack_148 = (undefined1  [8])0x0;
  __end1._M_dirs._M_ptr = (element_type *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)(attr.__glibc_reserved + 2));
  this = (recursive_directory_iterator *)((long)&imageId.field_2 + 8);
  do {
    if (__begin1._M_dirs._M_ptr == __end1._M_dirs._M_ptr) {
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)auStack_148);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)((long)&imageId.field_2 + 8));
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)&__begin1._M_dirs._M_refcount);
      return local_38;
    }
    ppVar5 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(this);
    sVar2 = (ppVar5->_M_pathname)._M_string_length;
    if (sVar2 == 0) {
LAB_0010b9f6:
      std::filesystem::__cxx11::path::path((path *)local_208);
    }
    else {
      uVar3 = *(ulong *)&ppVar5->_M_cmpts;
      uVar4 = (uint)uVar3;
      __p = ppVar5;
      if ((~(byte)uVar3 & 3) != 0) {
        if (((uVar3 & 3) == 0) && ((ppVar5->_M_pathname)._M_dataplus._M_p[sVar2 - 1] != '/')) {
          if ((uVar3 & 3) == 0) {
            lVar6 = std::filesystem::__cxx11::path::_List::end();
            __p = (path *)(lVar6 + -0x30);
            if ((*(ulong *)&ppVar5->_M_cmpts & 3) != 0) {
              __p = ppVar5;
            }
            uVar4 = (uint)*(undefined8 *)&__p->_M_cmpts;
          }
          if ((~uVar4 & 3) == 0) goto LAB_0010b9e8;
        }
        goto LAB_0010b9f6;
      }
LAB_0010b9e8:
      std::filesystem::__cxx11::path::path((path *)local_208,__p);
    }
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_208,(pointer)((long)local_208 + attr.st_dev));
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,".","");
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_80,&local_e0,&local_130);
    local_c0 = &imageId._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,*(size_type *)local_80,
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)local_80 + 8))->_M_allocated_capacity + *(size_type *)local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_208);
    memset((stat *)local_208,0,0x90);
    stat((ppVar5->_M_pathname)._M_dataplus._M_p,(stat *)local_208);
    __s = ctime(&attr.st_atim.tv_nsec);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,__s,(allocator<char> *)local_80);
    trimEnd((string *)local_110,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    uVar7 = std::filesystem::file_size(ppVar5);
    local_80 = (undefined1  [8])&__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,local_c0,imageId._M_dataplus._M_p + (long)local_c0);
    __str.field_2._8_8_ = uVar7;
    local_58._M_p = (pointer)&local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_110,lastModified._M_dataplus._M_p + (long)local_110);
    std::vector<Image,_std::allocator<Image>_>::emplace_back<Image>(local_38,(Image *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if (local_80 != (undefined1  [8])&__str._M_string_length) {
      operator_delete((void *)local_80,__str._M_string_length + 1);
    }
    if (local_110 != (undefined1  [8])&lastModified._M_string_length) {
      operator_delete((void *)local_110,lastModified._M_string_length + 1);
    }
    if (local_c0 != &imageId._M_string_length) {
      operator_delete(local_c0,imageId._M_string_length + 1);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++(this);
  } while( true );
}

Assistant:

std::vector<Image> getContainerImages(const std::string& rootDir)
{
    std::vector<Image> images;
    for (const auto& archive : std::filesystem::recursive_directory_iterator(rootDir + "/images"))
    {
        std::string imageId = split(archive.path().filename(), ".")[0];
        // Obtains the time at which the file was last modified
        struct stat attr{};
        stat(archive.path().c_str(), &attr);
        std::string lastModified(trimEnd(ctime(&attr.st_mtime)));

        uintmax_t fileSize = std::filesystem::file_size(archive);
        images.emplace_back(Image { imageId, fileSize, lastModified });
    }
    return images;
}